

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int check_function(JSContext *ctx,JSValue obj)

{
  ushort uVar1;
  char cVar2;
  
  if ((int)obj.tag == -1) {
    uVar1 = *(ushort *)((long)obj.u.ptr + 6);
    if (uVar1 != 0xd) {
      if (uVar1 == 0x29) {
        cVar2 = *(char *)(*(long *)((long)obj.u.ptr + 0x30) + 0x20);
      }
      else {
        cVar2 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
      }
      if (cVar2 == '\0') goto LAB_0013934d;
    }
    return 0;
  }
LAB_0013934d:
  JS_ThrowTypeError(ctx,"not a function");
  return -1;
}

Assistant:

BOOL JS_IsFunction(JSContext *ctx, JSValueConst val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return FALSE;
    p = JS_VALUE_GET_OBJ(val);
    switch(p->class_id) {
    case JS_CLASS_BYTECODE_FUNCTION:
        return TRUE;
    case JS_CLASS_PROXY:
        return p->u.proxy_data->is_func;
    default:
        return (ctx->rt->class_array[p->class_id].call != NULL);
    }
}